

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O1

void __thiscall QGles2Buffer::endFullDynamicBufferUpdateForCurrentFrame(QGles2Buffer *this)

{
  GLenum GVar1;
  undefined4 uVar2;
  QRhiImplementation *pQVar3;
  long *plVar4;
  Data *pDVar5;
  
  if (((this->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
       super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 4) != 0) {
    return;
  }
  pQVar3 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
  (**(code **)(*pQVar3[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.
                ptr + 400))(this->targetForDataOps,this->buffer);
  plVar4 = (long *)pQVar3[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase
                   .ptr;
  GVar1 = this->targetForDataOps;
  if ((pQVar3[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array[0x5f] & 2U) == 0) {
    uVar2 = *(undefined4 *)&(this->super_QRhiBuffer).field_0x3c;
    pDVar5 = (this->data).d.d;
    if ((pDVar5 == (Data *)0x0) ||
       (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&this->data,(AllocationOption)(this->data).d.size);
    }
    (**(code **)(*plVar4 + 0x1d0))(GVar1,0,uVar2,(this->data).d.ptr);
    return;
  }
  (**(code **)(*plVar4 + 0x4f0))(GVar1);
  return;
}

Assistant:

constexpr inline bool testFlags(QFlags flags) const noexcept { return flags.i ? ((i & flags.i) == flags.i) : i == Int(0); }